

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

int __thiscall helics::ActionMessage::serializedByteCount(ActionMessage *this)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  pointer pbVar2;
  int iVar3;
  
  str._0_4_ = 0x45;
  if (this->messageAction != cmd_time_request) {
    uVar1 = (this->payload).bufferSize;
    iVar3 = (int)uVar1 + 0x2d;
    for (pbVar2 = (this->stringData).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 != (this->stringData).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      iVar3 = iVar3 + (int)pbVar2->_M_string_length + 4;
    }
    str._0_4_ = iVar3 + 4;
    if (uVar1 < 0xffffff) {
      str._0_4_ = iVar3;
    }
  }
  return (int)str;
}

Assistant:

int ActionMessage::serializedByteCount() const
{
    int size{action_message_base_size};

    // for time request add an additional 3*8 bytes
    if (messageAction == CMD_TIME_REQUEST) {
        size += static_cast<int>(3 * sizeof(Time::baseType));
        return size;
    }
    size += static_cast<int>(payload.size());
    for (const auto& str : stringData) {
        // 4(to store the length)+length of the string
        size += static_cast<int>(sizeof(uint32_t) + str.size());
    }
    if (payload.size() >= maxPayloadSize) {
        size += 4;
    }
    return size;
}